

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_overlap(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t wVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  wchar_t x1;
  int iVar9;
  int iVar10;
  wchar_t wVar11;
  wchar_t y2;
  wchar_t y1;
  wchar_t y1_00;
  wchar_t x2;
  int iVar12;
  wchar_t wVar13;
  int iVar14;
  wchar_t x2_00;
  int iVar15;
  int iVar16;
  int iVar17;
  wchar_t wVar18;
  loc_conflict centre_local;
  
  wVar1 = c->depth;
  centre_local = centre;
  uVar3 = Rand_div(0x19);
  uVar4 = Rand_div(4);
  iVar17 = uVar4 + 1;
  uVar4 = Rand_div(0xb);
  iVar5 = uVar4 + 1;
  uVar4 = Rand_div(3);
  iVar12 = uVar4 + 1;
  uVar4 = Rand_div(10);
  iVar10 = uVar4 + 1;
  uVar4 = Rand_div(3);
  iVar9 = uVar4 + 1;
  uVar4 = Rand_div(10);
  iVar14 = uVar4 + 1;
  uVar4 = Rand_div(4);
  iVar15 = uVar4 + 1;
  uVar4 = Rand_div(0xb);
  iVar7 = uVar4 + 1;
  iVar16 = iVar12;
  if (iVar12 < iVar17) {
    iVar16 = iVar17;
  }
  iVar6 = iVar15;
  if (iVar15 < iVar9) {
    iVar6 = iVar9;
  }
  if (iVar6 < iVar16) {
    iVar6 = iVar16;
  }
  iVar16 = iVar10;
  if (iVar10 < iVar5) {
    iVar16 = iVar5;
  }
  iVar8 = iVar7;
  if (iVar7 < iVar14) {
    iVar8 = iVar14;
  }
  if (iVar8 < iVar16) {
    iVar8 = iVar16;
  }
  wVar18 = iVar6 * 2 + L'\x03';
  wVar13 = iVar8 * 2 + L'\x03';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar18,wVar13);
  if ((c->height <= centre.y) || (wVar11 = centre.y, c->width <= centre.x)) {
    _Var2 = find_space(&centre_local,wVar18,wVar13);
    if (!_Var2) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    wVar11 = centre_local.y;
  }
  wVar1 = (wchar_t)(wVar1 <= uVar3 + L'\x01');
  iVar16 = centre.x;
  y1 = (wVar11 - iVar17) + L'\xffffffff';
  wVar18 = (iVar16 - iVar5) + L'\xffffffff';
  wVar13 = iVar12 + wVar11 + L'\x01';
  x2 = iVar16 + iVar10 + L'\x01';
  generate_room(c,y1,wVar18,wVar13,x2,wVar1);
  y1_00 = (wVar11 - iVar9) + L'\xffffffff';
  x1 = (iVar16 - iVar14) + L'\xffffffff';
  y2 = wVar11 + L'\x01' + iVar15;
  x2_00 = iVar16 + 1 + iVar7;
  generate_room(c,y1_00,x1,y2,x2_00,wVar1);
  draw_rectangle(c,y1,wVar18,wVar13,x2,FEAT_GRANITE,L'\f',false);
  draw_rectangle(c,y1_00,x1,y2,x2_00,FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar11 - iVar17,iVar16 - iVar5,iVar12 + wVar11,iVar16 + iVar10,FEAT_FLOOR,L'\0');
  fill_rectangle(c,wVar11 - iVar9,iVar16 - iVar14,wVar11 + iVar15,iVar16 + iVar7,FEAT_FLOOR,L'\0');
  return true;
}

Assistant:

bool build_overlap(struct chunk *c, struct loc centre, int rating)
{
	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;
	int height, width;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Determine extents of room (a) */
	y1a = randint1(4);
	x1a = randint1(11);
	y2a = randint1(3);
	x2a = randint1(10);

	/* Determine extents of room (b) */
	y1b = randint1(3);
	x1b = randint1(10);
	y2b = randint1(4);
	x2b = randint1(11);

	/* Calculate height and width */
	height = 2 * MAX(MAX(y1a, y2a), MAX(y1b, y2b)) + 1;
	width = 2 * MAX(MAX(x1a, x2a), MAX(x1b, x2b)) + 1;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (a) */
	y1a = centre.y - y1a;
	x1a = centre.x - x1a;
	y2a = centre.y + y2a;
	x2a = centre.x + x2a;

	/* locate room (b) */
	y1b = centre.y - y1b;
	x1b = centre.x - x1b;
	y2b = centre.y + y2b;
	x2b = centre.x + x2b;

	/* Generate new room (a) */
	generate_room(c, y1a-1, x1a-1, y2a+1, x2a+1, light);

	/* Generate new room (b) */
	generate_room(c, y1b-1, x1b-1, y2b+1, x2b+1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a-1, x1a-1, y2a+1, x2a+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b-1, x1b-1, y2b+1, x2b+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	return true;
}